

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::AppendStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *str)

{
  int iVar1;
  char *pcVar2;
  pair<const_char_*,_bool> pVar3;
  
  pcVar2 = this->buffer_end_;
  if ((long)size <= (long)(pcVar2 + ((long)this->limit_ - (long)ptr))) {
    std::__cxx11::string::reserve((ulong)str);
    pcVar2 = this->buffer_end_;
  }
  iVar1 = ((int)pcVar2 - (int)ptr) + 0x10;
  while( true ) {
    std::__cxx11::string::append((char *)str,(ulong)ptr);
    if (this->limit_ == 0x10) {
      return (char *)0x0;
    }
    pVar3 = DoneFallback(this,ptr + iVar1,-1);
    ptr = pVar3.first;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) break;
    size = size - iVar1;
    iVar1 = (*(int *)&this->buffer_end_ - (int)pVar3.first) + 0x10;
    if (size <= iVar1) {
      std::__cxx11::string::append((char *)str,(ulong)ptr);
      return ptr + size;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::AppendStringFallback(const char* ptr, int size,
                                                     std::string* str) {
  // TODO(gerbens) assess security. At the moment its parity with
  // CodedInputStream but it allows a payload to reserve large memory.
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    str->reserve(size);
  }
  return AppendSize(ptr, size,
                    [str](const char* p, int s) { str->append(p, s); });
}